

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

void YAML::QueueUnicodeCodepoint(deque<char,_std::allocator<char>_> *q,unsigned_long ch)

{
  char cVar1;
  ulong in_RSI;
  deque<char,_std::allocator<char>_> *in_RDI;
  value_type_conflict3 *in_stack_ffffffffffffff88;
  deque<char,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined8 local_10;
  
  cVar1 = Stream::eof();
  local_10 = in_RSI;
  if ((long)cVar1 == in_RSI) {
    local_10 = 0xfffd;
  }
  if (local_10 < 0x80) {
    Utf8Adjust(local_10,'\0','\0');
    std::deque<char,_std::allocator<char>_>::push_back
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  else if (local_10 < 0x800) {
    Utf8Adjust(local_10,'\x02','\x06');
    std::deque<char,_std::allocator<char>_>::push_back
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    Utf8Adjust(local_10,'\x01','\0');
    std::deque<char,_std::allocator<char>_>::push_back
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  else if (local_10 < 0x10000) {
    Utf8Adjust(local_10,'\x03','\f');
    std::deque<char,_std::allocator<char>_>::push_back
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    Utf8Adjust(local_10,'\x01','\x06');
    std::deque<char,_std::allocator<char>_>::push_back
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    Utf8Adjust(local_10,'\x01','\0');
    std::deque<char,_std::allocator<char>_>::push_back
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  else {
    Utf8Adjust(local_10,'\x04','\x12');
    std::deque<char,_std::allocator<char>_>::push_back(in_RDI,in_stack_ffffffffffffff88);
    Utf8Adjust(local_10,'\x01','\f');
    std::deque<char,_std::allocator<char>_>::push_back(in_RDI,in_stack_ffffffffffffff88);
    Utf8Adjust(local_10,'\x01','\x06');
    std::deque<char,_std::allocator<char>_>::push_back(in_RDI,in_stack_ffffffffffffff88);
    Utf8Adjust(local_10,'\x01','\0');
    std::deque<char,_std::allocator<char>_>::push_back(in_RDI,in_stack_ffffffffffffff88);
  }
  return;
}

Assistant:

inline void QueueUnicodeCodepoint(std::deque<char>& q, unsigned long ch) {
  // We are not allowed to queue the Stream::eof() codepoint, so
  // replace it with CP_REPLACEMENT_CHARACTER
  if (static_cast<unsigned long>(Stream::eof()) == ch) {
    ch = CP_REPLACEMENT_CHARACTER;
  }

  if (ch < 0x80) {
    q.push_back(Utf8Adjust(ch, 0, 0));
  } else if (ch < 0x800) {
    q.push_back(Utf8Adjust(ch, 2, 6));
    q.push_back(Utf8Adjust(ch, 1, 0));
  } else if (ch < 0x10000) {
    q.push_back(Utf8Adjust(ch, 3, 12));
    q.push_back(Utf8Adjust(ch, 1, 6));
    q.push_back(Utf8Adjust(ch, 1, 0));
  } else {
    q.push_back(Utf8Adjust(ch, 4, 18));
    q.push_back(Utf8Adjust(ch, 1, 12));
    q.push_back(Utf8Adjust(ch, 1, 6));
    q.push_back(Utf8Adjust(ch, 1, 0));
  }
}